

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

void vera::setWindowIcon(uchar *_data,size_t _width,size_t _height)

{
  GLFWimage image;
  GLFWimage local_10;
  
  local_10.width = (int)_width;
  local_10.height = (int)_height;
  local_10.pixels = _data;
  glfwSetWindowIcon(window,1,&local_10);
  return;
}

Assistant:

void setWindowIcon(unsigned char* _data, size_t _width, size_t _height) {
#if defined(DRIVER_GLFW)
    GLFWimage image;
    image.pixels = _data;
    image.width = _width;
    image.height = _height;
    glfwSetWindowIcon(window, 1, &image);
#endif
}